

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O0

void __thiscall
VGMPlayer::ParseXHdr_Data16
          (VGMPlayer *this,UINT32 fileOfs,
          vector<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_> *xData)

{
  UINT16 UVar1;
  UINT32 UVar2;
  XHDR_DATA16 *pXVar3;
  reference pvVar4;
  XHDR_DATA16 *cData;
  size_t curChip;
  UINT32 curPos;
  vector<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_> *xData_local;
  UINT32 fileOfs_local;
  VGMPlayer *this_local;
  
  std::vector<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>::clear(xData);
  if ((fileOfs != 0) && (UVar2 = DataLoader_GetSize(this->_dLoad), fileOfs < UVar2)) {
    std::vector<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>::resize
              (xData,(ulong)this->_fileData[fileOfs]);
    curChip._4_4_ = fileOfs + 1;
    for (cData = (XHDR_DATA16 *)0x0;
        pXVar3 = (XHDR_DATA16 *)
                 std::vector<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>::size
                           (xData), cData < pXVar3; cData = (XHDR_DATA16 *)&cData->flags) {
      UVar2 = DataLoader_GetSize(this->_dLoad);
      if (UVar2 < curChip._4_4_ + 4) {
        std::vector<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>::resize
                  (xData,(size_type)cData);
        return;
      }
      pvVar4 = std::vector<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>::
               operator[](xData,(size_type)cData);
      pvVar4->type = this->_fileData[curChip._4_4_];
      pvVar4->flags = this->_fileData[curChip._4_4_ + 1];
      UVar1 = ReadLE16(this->_fileData + (curChip._4_4_ + 2));
      pvVar4->data = UVar1;
      curChip._4_4_ = curChip._4_4_ + 4;
    }
  }
  return;
}

Assistant:

void VGMPlayer::ParseXHdr_Data16(UINT32 fileOfs, std::vector<XHDR_DATA16>& xData)
{
	xData.clear();
	if (! fileOfs || fileOfs >= DataLoader_GetSize(_dLoad))
		return;
	
	UINT32 curPos = fileOfs;
	size_t curChip;
	
	xData.resize(_fileData[curPos]);	curPos ++;
	for (curChip = 0; curChip < xData.size(); curChip ++, curPos += 0x04)
	{
		if (curPos + 0x04 > DataLoader_GetSize(_dLoad))
		{
			xData.resize(curChip);
			break;
		}
		
		XHDR_DATA16& cData = xData[curChip];
		cData.type = _fileData[curPos + 0x00];
		cData.flags = _fileData[curPos + 0x01];
		cData.data = ReadLE16(&_fileData[curPos + 0x02]);
	}
	
	return;
}